

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

void transfer_lights(level *oldlev,level *newlev,uint obj_id)

{
  boolean bVar1;
  ls_t *plVar2;
  ls_t *plVar3;
  bool bVar4;
  
  if ((newlev != oldlev) && (plVar2 = oldlev->lev_lights, plVar2 != (ls_t *)0x0)) {
    plVar3 = (ls_t *)&oldlev->lev_lights;
    do {
      if (plVar2->type == 1) {
        if (obj_id == 0) {
          bVar4 = *(char *)((long)plVar2->id + 0x4f) < '\x01';
          goto LAB_001b3385;
        }
LAB_001b33a4:
        plVar3 = plVar3->next;
      }
      else {
        if (plVar2->type != 0) goto LAB_001b33a4;
        if (obj_id == 0) {
          bVar1 = obj_is_local((obj *)plVar2->id);
          bVar4 = bVar1 == '\0';
        }
        else {
          bVar4 = ((obj *)plVar2->id)->o_id == obj_id;
        }
LAB_001b3385:
        if (!bVar4) goto LAB_001b33a4;
        plVar3->next = plVar2->next;
        plVar2->next = newlev->lev_lights;
        newlev->lev_lights = plVar2;
      }
      plVar2 = plVar3->next;
    } while (plVar2 != (ls_t *)0x0);
  }
  return;
}

Assistant:

void transfer_lights(struct level *oldlev, struct level *newlev, unsigned int obj_id)
{
    light_source **prev, *curr;
    boolean transfer;

    if (newlev == oldlev)
	return;

    for (prev = &oldlev->lev_lights; (curr = *prev) != 0; ) {
	switch (curr->type) {
	    case LS_OBJECT:
		if (obj_id)
		    transfer = (((struct obj *)curr->id)->o_id == obj_id);
		else
		    transfer = !obj_is_local((struct obj *)curr->id);
		break;
	    case LS_MONSTER:
		if (obj_id)
		    transfer = FALSE;
		else
		    transfer = !mon_is_local((struct monst *)curr->id);
		break;
	    default:
		transfer = FALSE;
		break;
	}
	/* associate light sources with the new level */
	if (transfer) {
	    *prev = curr->next;
	    curr->next = newlev->lev_lights;
	    newlev->lev_lights = curr;
	} else {
	    prev = &(*prev)->next;
	}
    }
}